

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2002>(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  Arena *pAVar2;
  Rep *pRVar3;
  bool bVar4;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  RVar5;
  ostream *poVar6;
  long lVar7;
  string *this;
  stringstream *this_00;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar8;
  undefined1 *puVar9;
  long lVar10;
  string *psVar11;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  allocator_type local_241;
  FeatureDescription modelOutputFeature;
  string local_210;
  void **local_1f0;
  long local_1e8;
  Result result;
  stringstream ss;
  string local_1b0 [8];
  ostream local_1a8 [376];
  
  puVar9 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar9 == (ModelDescription *)0x0) {
    puVar9 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"Model not a vision feature print.",
               (allocator<char> *)&modelOutputFeature);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
    this_00 = &ss;
    goto LAB_00287dec;
  }
  Result::Result(&result);
  local_210._M_dataplus._M_p._0_4_ = 4;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_210;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)&modelOutputFeature,__l,&local_241);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)&ss,(CoreML *)&((ModelDescription *)puVar9)->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
             (int)&modelOutputFeature,in_R8);
  Result::operator=(&result,(Result *)&ss);
  std::__cxx11::string::~string(local_1b0);
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *)&modelOutputFeature);
  bVar4 = Result::good(&result);
  if (!bVar4) goto LAB_00287b7d;
  if (format->_oneof_case_[0] == 0x7d2) {
    puVar8 = (undefined1 *)(format->Type_).pipeline_;
  }
  else {
    puVar8 = Specification::CoreMLModels::_VisionFeaturePrint_default_instance_;
  }
  iVar1 = (((Pipeline *)puVar8)->models_).super_RepeatedPtrFieldBase.total_size_;
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"Type for vision feature print not set",
               (allocator<char> *)&modelOutputFeature);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
    goto LAB_00287bbb;
  }
  if (iVar1 == 0x14) {
    iVar1 = *(int *)((((Pipeline *)puVar8)->models_).super_RepeatedPtrFieldBase.arena_ + 0x10);
    if (iVar1 - 1U < 2) {
      local_210._M_dataplus._M_p._0_4_ = 5;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_210;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&modelOutputFeature,__l_00,&local_241);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)&ss,(CoreML *)&((ModelDescription *)puVar9)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
                 (int)&modelOutputFeature,in_R8);
      Result::operator=(&result,(Result *)&ss);
      std::__cxx11::string::~string(local_1b0);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&modelOutputFeature);
      Result::good(&result);
      goto LAB_00287b7d;
    }
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"Version for scene is invalid",(allocator<char> *)&modelOutputFeature
                );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
      goto LAB_00287bbb;
    }
    std::__cxx11::to_string(&local_210,iVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &modelOutputFeature,"Version: \'",&local_210);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &modelOutputFeature,"\' for scene print is invalid");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
LAB_00287dc6:
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&modelOutputFeature);
    this = &local_210;
LAB_00287de2:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    if (iVar1 == 0x15) {
      pAVar2 = (((Pipeline *)puVar8)->models_).super_RepeatedPtrFieldBase.arena_;
      iVar1 = *(int *)(pAVar2 + 0x28);
      if (iVar1 == 1) {
        if (*(int *)(pAVar2 + 0x18) == 2) {
          local_210._M_dataplus._M_p._0_4_ = 5;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_210;
          std::
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    *)&modelOutputFeature,__l_01,&local_241);
          validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                    ((Result *)&ss,(CoreML *)&((ModelDescription *)puVar9)->output_,
                     (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x2,
                     (int)&modelOutputFeature,in_R8);
          Result::operator=(&result,(Result *)&ss);
          std::__cxx11::string::~string(local_1b0);
          std::
          _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)&modelOutputFeature);
          bVar4 = Result::good(&result);
          if (bVar4) {
            pRVar3 = (((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.rep_;
            local_1f0 = pRVar3->elements;
            if (pRVar3 == (Rep *)0x0) {
              local_1f0 = (void **)0x0;
            }
            local_1e8 = (long)(((ModelDescription *)puVar9)->output_).super_RepeatedPtrFieldBase.
                              current_size_ << 3;
            for (lVar10 = 0; local_1e8 != lVar10; lVar10 = lVar10 + 8) {
              Specification::FeatureDescription::FeatureDescription
                        (&modelOutputFeature,*(FeatureDescription **)((long)local_1f0 + lVar10));
              puVar9 = Specification::CoreMLModels::_VisionFeaturePrint_Objects_default_instance_;
              if ((((Pipeline *)puVar8)->models_).super_RepeatedPtrFieldBase.total_size_ == 0x15) {
                puVar9 = (((Pipeline *)puVar8)->models_).super_RepeatedPtrFieldBase.arena_;
              }
              psVar11 = (string *)
                        ((ulong)modelOutputFeature.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe);
              lVar7 = *(long *)((Arena *)puVar9 + 0x20) + 8;
              if (*(long *)((Arena *)puVar9 + 0x20) == 0) {
                lVar7 = 0;
              }
              RVar5 = std::
                      __find_if<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                (lVar7,lVar7 + (long)*(int *)((Arena *)puVar9 + 0x18) * 8,psVar11);
              lVar7 = *(long *)((Arena *)puVar9 + 0x20) + 8;
              if (*(long *)((Arena *)puVar9 + 0x20) == 0) {
                lVar7 = 0;
              }
              if (RVar5.it_ == (void **)(lVar7 + (long)*(int *)((Arena *)puVar9 + 0x18) * 8)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&ss);
                poVar6 = std::operator<<(local_1a8,"Model description declares an output: ");
                poVar6 = std::operator<<(poVar6,psVar11);
                std::operator<<(poVar6," but it is not declared in Vision Feature Print output");
                std::__cxx11::stringbuf::str();
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_210);
                std::__cxx11::string::~string((string *)&local_210);
                std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
                Specification::FeatureDescription::~FeatureDescription(&modelOutputFeature);
                goto LAB_00287de7;
              }
              Specification::FeatureDescription::~FeatureDescription(&modelOutputFeature);
            }
          }
          goto LAB_00287b7d;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"Two outputs for objects need to be provided",
                   (allocator<char> *)&modelOutputFeature);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
      }
      else {
        if (iVar1 != 0) {
          std::__cxx11::to_string(&local_210,iVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &modelOutputFeature,"Version: \'",&local_210);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &modelOutputFeature,"\' for object print is invalid");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
          goto LAB_00287dc6;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ss,"Version for objects is invalid",
                   (allocator<char> *)&modelOutputFeature);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ss);
      }
LAB_00287bbb:
      this = (string *)&ss;
      goto LAB_00287de2;
    }
LAB_00287b7d:
    Result::Result(__return_storage_ptr__,&result);
  }
LAB_00287de7:
  this_00 = (stringstream *)&result.m_message;
LAB_00287dec:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_visionFeaturePrint>(const Specification::Model &format) {
        const auto &interface = format.description();

        // make sure model is a vision feature print
        if (!format.has_visionfeatureprint()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a vision feature print.");
        }

        Result result;

        // validate the inputs: only one input with image type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kImageType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &visionFeaturePrint = format.visionfeatureprint();
        switch (visionFeaturePrint.VisionFeaturePrintType_case()) {
            case Specification::CoreMLModels::VisionFeaturePrint::kScene:
                if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for scene is invalid");
                } else if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1 || visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_2) {
                    // validate the outputs: only one output with multiarray type is allowed for version 1 and version 2.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.scene().version()) + "' for scene print is invalid");
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::kObjects:
                if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for objects is invalid");
                } else if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1) {

                    if (visionFeaturePrint.objects().output_size() != 2) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "Two outputs for objects need to be provided");
                    }

                    // validate the outputs: only two outputs with multiarray type is allowed for version 1.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 2, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.objects().version()) + "' for object print is invalid");
                }

                for (auto modelOutputFeature : interface.output()) {
                    const std::string &modelOutputFeatureName = modelOutputFeature.name();
                    const auto &visionFeaturePrintOutputNames = visionFeaturePrint.objects().output();
                    if (find(visionFeaturePrintOutputNames.begin(), visionFeaturePrintOutputNames.end(), modelOutputFeatureName) == visionFeaturePrintOutputNames.end()) {
                        std::stringstream ss;
                        ss << "Model description declares an output: " << modelOutputFeatureName << " but it is not declared in Vision Feature Print output";
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
                    }
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::VISIONFEATUREPRINTTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for vision feature print not set");
        }

        return result;
    }